

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  void *pvVar1;
  pointer pTVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  pointer hex;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  initializer_list<TestFundElementsUtxoVector> __l;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext context;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  UtxoFilter filter;
  ElementsUtxoAndOption txin_utxo;
  ConfidentialAssetId fee_asset;
  CoinSelectionOption option;
  ElementsAddressFactory factory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ExtPubkey key;
  ElementsConfidentialAddress ct_addr1;
  ConfidentialTransactionController ctx;
  ElementsConfidentialAddress reserve_ct_addr1;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ConfidentialTransactionContext tx;
  Address addr3;
  Address addr2;
  Address addr1;
  Address addr;
  undefined1 local_17c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17b8;
  Txid local_17a0;
  ElementsTransactionApi local_1779;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1778;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1758;
  string local_1740;
  undefined1 local_1720 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1710 [12];
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1648;
  string local_1628;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_1608;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_15e8;
  long local_15d0;
  UtxoFilter local_15c4;
  undefined1 local_15c0 [9];
  undefined7 uStack_15b7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15b0;
  uint32_t local_15a0;
  undefined1 local_1598 [16];
  pointer local_1588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1580;
  _Alloc_hider local_1570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1560;
  pointer local_1550;
  pointer local_1548;
  undefined1 local_1540 [16];
  undefined4 local_1530;
  pointer local_1528;
  string local_1520;
  uchar *local_1500 [2];
  uchar local_14f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14e0;
  undefined1 local_14d0 [16];
  undefined4 local_14c0;
  pointer local_14b8;
  string local_14b0;
  uchar *local_1490 [2];
  uchar local_1480 [16];
  uchar *local_1470 [2];
  uchar local_1460 [16];
  undefined4 local_1450;
  pointer local_1448;
  string local_1440;
  pointer local_1420 [2];
  undefined1 local_1410 [16];
  ByteData256 *local_1400;
  ByteData256 local_13f0;
  pointer local_13d8;
  string local_13d0;
  pointer local_13b0 [2];
  undefined1 local_13a0 [16];
  _Base_ptr local_1390;
  undefined1 local_1380 [32];
  undefined1 local_1360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1350;
  undefined1 local_1340 [32];
  _func_int **local_1320 [2];
  _func_int *local_1310 [2];
  undefined4 local_1300;
  undefined1 local_12f8 [40];
  uchar *local_12d0 [2];
  uchar local_12c0 [16];
  _func_int **local_12b0 [2];
  _func_int *local_12a0 [2];
  undefined4 local_1290;
  pointer local_1288;
  string local_1280;
  pointer local_1260 [2];
  undefined1 local_1250 [16];
  pointer local_1240;
  undefined1 local_1230 [32];
  string local_1210;
  pointer local_11f0 [2];
  undefined1 local_11e0 [16];
  pointer local_11d0;
  undefined1 local_11c0 [32];
  string local_11a0;
  _Alloc_hider local_1180;
  char local_1170 [16];
  pointer local_1160 [2];
  undefined1 local_1150 [64];
  pointer local_1110 [2];
  undefined1 local_1100 [16];
  pointer local_10f0;
  undefined1 local_10e0 [32];
  string local_10c0;
  pointer local_10a0;
  undefined2 local_1098;
  bool local_1096;
  uint32_t local_1094;
  undefined1 local_1090 [96];
  long local_1030;
  ConfidentialAssetId local_1020;
  Privkey local_ff8;
  undefined1 local_fd8 [56];
  undefined **local_fa0;
  pointer local_f98;
  pointer local_f88;
  AddressFactory local_f70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_f48;
  Amount local_f18;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f08;
  ExtPubkey local_ed8;
  undefined1 local_e48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38 [23];
  pointer local_cc8;
  pointer local_cb8;
  _Alloc_hider local_cb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ca0;
  SigHashType local_c8c;
  ConfidentialTransactionController local_c80;
  void *local_c30 [2];
  _Alloc_hider local_c20;
  pointer local_ab0;
  pointer local_aa0;
  _Alloc_hider local_a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a88;
  void *local_a78 [2];
  _Alloc_hider local_a68;
  pointer local_8f8;
  pointer local_8e8;
  _Alloc_hider local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  void *local_8c0 [2];
  _Alloc_hider local_8b0;
  pointer local_740;
  pointer local_730;
  _Alloc_hider local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  ConfidentialTransactionContext local_708;
  Address local_630;
  Address local_4b0;
  Address local_330;
  Address local_1b0;
  
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar5 != 0) {
      local_15c0._0_8_ = &local_15b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_15c0,
                 "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a","");
      local_15a0 = 0;
      local_1598._0_8_ = &DAT_12a05f20;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_1598 + 8),&exp_dummy_asset_a);
      local_1570._M_p = (pointer)&local_1560;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1570,
                 "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))","");
      local_1550 = (pointer)local_1540;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1550,
                 "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a","");
      local_1530 = 0;
      local_1528 = &DAT_04a817c8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1520,&exp_dummy_asset_a);
      local_1500[0] = local_14f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1500,
                 "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))","");
      local_14e0._M_allocated_capacity = (size_type)local_14d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_14e0,
                 "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a","");
      local_14c0 = 0;
      local_14b8 = &DAT_4a817c80;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_14b0,&exp_dummy_asset_a);
      local_1490[0] = local_1480;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1490,
                 "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))","");
      local_1470[0] = local_1460;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1470,
                 "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a","");
      local_1450 = 0;
      local_1448 = (pointer)&DAT_02540be4;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1440,&exp_dummy_asset_a);
      local_1420[0] = (pointer)local_1410;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1420,
                 "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))","");
      local_1400 = &local_13f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1400,
                 "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a","");
      local_13f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_13d8 = (pointer)&DAT_09502f90;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_13d0,&exp_dummy_asset_a);
      local_13b0[0] = (pointer)local_13a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13b0,
                 "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))","");
      local_1390 = (_Base_ptr)local_1380;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1390,
                 "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b","");
      local_1380._16_4_ = 0;
      local_1380._24_8_ = 2500000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1360,&exp_dummy_asset_a);
      local_1340._0_8_ = local_1340 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1340,
                 "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))","");
      local_1320[0] = local_1310;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1340 + 0x20),
                 "0000000000000000000000000000000000000000000000000000000000000b01","");
      local_1300 = 0;
      local_12f8._0_8_ = &DAT_019abe00;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_12f8 + 8),&exp_dummy_asset_b);
      local_12d0[0] = local_12c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d0,
                 "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))","");
      local_12b0[0] = local_12a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12b0,
                 "0000000000000000000000000000000000000000000000000000000000000b02","");
      local_1290 = 0;
      local_1288 = &DAT_000b71b0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1280,&exp_dummy_asset_b);
      local_1260[0] = (pointer)local_1250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1260,
                 "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))","");
      local_1240 = (pointer)local_1230;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1240,
                 "0000000000000000000000000000000000000000000000000000000000000b03","");
      local_1230._16_4_ = 0;
      local_1230._24_8_ = &DAT_14a61a62;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_1230 + 0x20),&exp_dummy_asset_b);
      local_11f0[0] = (pointer)local_11e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_11f0,
                 "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))","");
      local_11d0 = (pointer)local_11c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_11d0,
                 "0000000000000000000000000000000000000000000000000000000000000b04","");
      local_11c0._16_4_ = 0;
      local_11c0._24_8_ = &DAT_0119ed3e;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_11c0 + 0x20),&exp_dummy_asset_b);
      local_1180._M_p = local_1170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1180,
                 "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))","");
      local_1160[0] = (pointer)local_1150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1160,
                 "0000000000000000000000000000000000000000000000000000000000000c01","");
      local_1150._16_4_ = 0;
      local_1150._24_8_ = &DAT_023e8eb8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_1150 + 0x20),&exp_dummy_asset_c);
      local_1110[0] = (pointer)local_1100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1110,
                 "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))","");
      local_10f0 = (pointer)local_10e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10f0,
                 "0000000000000000000000000000000000000000000000000000000000000c02","");
      local_10e0._16_4_ = 0;
      local_10e0._24_8_ = &DAT_079252f0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_10c0,&exp_dummy_asset_c);
      local_10a0 = (pointer)local_1090;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10a0,
                 "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))","");
      __l._M_len = 0xc;
      __l._M_array = (iterator)local_15c0;
      std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
                (&TestBody::kFundCoinSelectElementsTestVector3,__l,(allocator_type *)local_e48);
      lVar6 = 0x4d0;
      do {
        TestFundElementsUtxoVector::~TestFundElementsUtxoVector
                  ((TestFundElementsUtxoVector *)(local_15c0 + lVar6));
        lVar6 = lVar6 + -0x70;
      } while (lVar6 != -0x70);
      __cxa_atexit(std::
                   vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                   ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar5 != 0) {
      TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::kExpTxData_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_f70,kLiquidV1);
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&local_708,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_1758,
             ((long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar2 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
    hex = TestBody::kFundCoinSelectElementsTestVector3.
          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_e48);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_15c0,&hex->txid);
        cfd::core::Txid::operator=((Txid *)local_e48,(Txid *)local_15c0);
        local_15c0._0_8_ = &PTR__Txid_0087c9b8;
        pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
        }
      }
      cfd::core::Txid::Txid((Txid *)local_15c0,&hex->txid);
      cfd::core::Txid::operator=
                (&local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8].txid,(Txid *)local_15c0);
      local_15c0._0_8_ = &PTR__Txid_0087c9b8;
      pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
      }
      local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8].vout = hex->vout;
      cfd::core::Amount::Amount((Amount *)local_15c0,hex->amount);
      local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8].amount.ignore_check_ = (bool)local_15c0[8];
      local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8].amount.amount_ = local_15c0._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_15c0,&hex->asset);
      cfd::core::ConfidentialAssetId::operator=
                (&local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8].asset,
                 (ConfidentialAssetId *)local_15c0);
      local_15c0._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
      pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8].descriptor);
      local_1758.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8].address_type = kP2shP2wpkhAddress;
      local_e48._0_8_ = &PTR__Txid_0087c9b8;
      if ((pointer)local_e48._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_e48._8_8_,local_e38[0]._8_8_ - local_e48._8_8_);
      }
      hex = hex + 1;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (hex != pTVar2);
  }
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_ed8,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1020,&exp_dummy_asset_a);
  local_f48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f48._M_impl.super__Rb_tree_header._M_header;
  local_f48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f48._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_e48,0x6e6f7c0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (Amount *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)local_e48,0x14b18c08);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (Amount *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_c);
  cfd::core::Amount::Amount((Amount *)local_e48,0x23e8e54);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (Amount *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h","");
  cfd::AddressFactory::GetAddress(&local_1b0,&local_f70,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e","");
  cfd::AddressFactory::GetAddress(&local_330,&local_f70,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn","");
  cfd::AddressFactory::GetAddress(&local_4b0,&local_f70,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_15c0._0_8_ = &local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m","");
  cfd::AddressFactory::GetAddress(&local_630,&local_f70,(string *)local_15c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  local_f08._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f08._M_impl.super__Rb_tree_header._M_header;
  local_f08._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f08._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f08._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f08._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f08._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_e48,&local_330);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_f08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._0_8_ != local_e38) {
    operator_delete((void *)local_e48._0_8_,(ulong)(local_e38[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_e48,&local_4b0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_f08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._0_8_ != local_e38) {
    operator_delete((void *)local_e48._0_8_,(ulong)(local_e38[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_15c0,&exp_dummy_asset_c);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_e48,&local_630);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_f08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._0_8_ != local_e38) {
    operator_delete((void *)local_e48._0_8_,(ulong)(local_e38[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._0_8_ != &local_15b0) {
    operator_delete((void *)local_15c0._0_8_,local_15b0._M_allocated_capacity + 1);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_15c0,&local_ed8,0x5a);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_c30,(Extkey *)local_15c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_e48,&local_1b0,(ConfidentialKey *)local_c30);
  if (local_c30[0] != (void *)0x0) {
    operator_delete(local_c30[0],(long)local_c20._M_p - (long)local_c30[0]);
  }
  if (local_1548 != (pointer)0x0) {
    operator_delete(local_1548,local_1540._8_8_ - (long)local_1548);
  }
  if ((pointer)local_1560._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1560._M_allocated_capacity,(long)local_1550 - local_1560._0_8_);
  }
  if ((pointer)local_1580._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1580._M_allocated_capacity,
                    (long)local_1570._M_p - local_1580._0_8_);
  }
  if ((_func_int **)local_1598._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1598._0_8_,(long)local_1588 - local_1598._0_8_);
  }
  pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_15c0,&local_ed8,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_8c0,(Extkey *)local_15c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_c30,&local_330,(ConfidentialKey *)local_8c0);
  if (local_8c0[0] != (void *)0x0) {
    operator_delete(local_8c0[0],(long)local_8b0._M_p - (long)local_8c0[0]);
  }
  if (local_1548 != (pointer)0x0) {
    operator_delete(local_1548,local_1540._8_8_ - (long)local_1548);
  }
  if ((pointer)local_1560._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1560._M_allocated_capacity,(long)local_1550 - local_1560._0_8_);
  }
  if ((pointer)local_1580._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1580._M_allocated_capacity,
                    (long)local_1570._M_p - local_1580._0_8_);
  }
  if ((_func_int **)local_1598._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1598._0_8_,(long)local_1588 - local_1598._0_8_);
  }
  pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_15c0,&local_ed8,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_a78,(Extkey *)local_15c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_8c0,&local_4b0,(ConfidentialKey *)local_a78);
  if (local_a78[0] != (void *)0x0) {
    operator_delete(local_a78[0],(long)local_a68._M_p - (long)local_a78[0]);
  }
  if (local_1548 != (pointer)0x0) {
    operator_delete(local_1548,local_1540._8_8_ - (long)local_1548);
  }
  if ((pointer)local_1560._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1560._M_allocated_capacity,(long)local_1550 - local_1560._0_8_);
  }
  if ((pointer)local_1580._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1580._M_allocated_capacity,
                    (long)local_1570._M_p - local_1580._0_8_);
  }
  if ((_func_int **)local_1598._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1598._0_8_,(long)local_1588 - local_1598._0_8_);
  }
  pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_15c0,&local_ed8,0x5d);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_1720,(Extkey *)local_15c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_a78,&local_630,(ConfidentialKey *)local_1720);
  if (local_1720 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1720,local_1710[0]._M_allocated_capacity - (long)local_1720);
  }
  if (local_1548 != (pointer)0x0) {
    operator_delete(local_1548,local_1540._8_8_ - (long)local_1548);
  }
  if ((pointer)local_1560._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1560._M_allocated_capacity,(long)local_1550 - local_1560._0_8_);
  }
  if ((pointer)local_1580._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1580._M_allocated_capacity,
                    (long)local_1570._M_p - local_1580._0_8_);
  }
  if ((_func_int **)local_1598._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1598._0_8_,(long)local_1588 - local_1598._0_8_);
  }
  pvVar1 = (void *)CONCAT71(uStack_15b7,local_15c0[8]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_15b0._8_8_ - (long)pvVar1);
  }
  local_15e8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15e8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1608.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1608.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1608.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cfd::UtxoData::UtxoData((UtxoData *)local_15c0);
  local_1098._0_1_ = false;
  local_1098._1_1_ = false;
  local_1096 = false;
  local_1094 = 0;
  cfd::core::Script::Script((Script *)local_1090);
  local_1090._56_4_ = 0;
  local_fd8._0_8_ = local_fd8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fd8,"9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",
             "");
  cfd::core::Txid::Txid((Txid *)local_1720,(string *)local_fd8);
  cfd::core::Txid::operator=((Txid *)local_1598,(Txid *)local_1720);
  local_1720 = (undefined1  [8])&PTR__Txid_0087c9b8;
  pvVar1 = (void *)CONCAT71(local_1718.ptr_._1_7_,local_1718.ptr_._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_1710[0]._8_8_ - (long)pvVar1);
  }
  if ((undefined1 *)local_fd8._0_8_ != local_fd8 + 0x10) {
    operator_delete((void *)local_fd8._0_8_,local_fd8._16_8_ + 1);
  }
  cfd::core::Amount::Amount((Amount *)local_1720,0x6b22c20);
  local_1360[8] = local_1718.ptr_._0_1_;
  local_1360._0_8_ = local_1720;
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_1340,&exp_dummy_asset_a);
  std::__cxx11::string::_M_replace((ulong)local_1380,0,(char *)local_1380._8_8_,0x5c5cfe);
  local_1350._M_allocated_capacity._0_4_ = kP2shP2wpkhAddress;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back(&local_1608,(value_type *)local_15c0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            (&local_15e8,(value_type *)local_15c0);
  cfd::core::Amount::Amount(&local_f18);
  local_1778.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1778.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1778.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_fd8);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo((CoinSelectionOption *)local_fd8);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate((CoinSelectionOption *)local_fd8,0.15);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate((CoinSelectionOption *)local_fd8,0.15);
  cfd::CoinSelectionOption::SetFeeAsset((CoinSelectionOption *)local_fd8,&local_1020);
  cfd::CoinSelectionOption::SetBlindInfo((CoinSelectionOption *)local_fd8,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1720,(AbstractTransaction *)&local_708);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&local_c80,&local_1779,(string *)local_1720,&local_1758,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_f48,&local_1608,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_f08,&local_1020,true,0.15,&local_f18,&local_15c4,
             (CoinSelectionOption *)local_fd8,&local_1778,kCfdOutOfRangeError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_1720 != (undefined1  [8])local_1710) {
    operator_delete((void *)local_1720,(ulong)(local_1710[0]._M_allocated_capacity + 1));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_1720,&local_c80.super_AbstractTransactionController);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_17c8,"kExpTxData","ctx.GetHex()",&TestBody()::kExpTxData_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1720);
  if (local_1720 != (undefined1  [8])local_1710) {
    operator_delete((void *)local_1720,(ulong)(local_1710[0]._M_allocated_capacity + 1));
  }
  if (local_17c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1720);
    if ((pointer)local_17c8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_17c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_17a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_1720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
    if (local_1720 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_1720 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_1720 + 8))();
      }
      local_1720 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_17c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_17a0._vptr_Txid = (_func_int **)CONCAT44(local_17a0._vptr_Txid._4_4_,0x26a);
  local_17c8._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_f18);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_1720,"618","estimate_fee.GetSatoshiValue()",(int *)&local_17a0,
             (long *)local_17c8);
  if (local_1720[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_17c8);
    if ((undefined8 *)CONCAT71(local_1718.ptr_._1_7_,local_1718.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_1718.ptr_._1_7_,local_1718.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_17a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_17c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_17c8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_17c8._0_8_ + 8))();
      }
      local_17c8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1718,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_17c8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_17a0._vptr_Txid =
       (_func_int **)
       ((long)local_1778.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1778.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1720,"size_t{3}","append_txout_addresses.size()",
             (unsigned_long *)local_17c8,(unsigned_long *)&local_17a0);
  if (local_1720[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_17c8);
    if ((undefined8 *)CONCAT71(local_1718.ptr_._1_7_,local_1718.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_1718.ptr_._1_7_,local_1718.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_17a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_17c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17c8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_17c8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_17c8._0_8_ + 8))();
      }
      local_17c8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1718,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_1778.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1778.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1720,&local_330);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_17c8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",(char *)local_1720,
               local_1778.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
    if (local_1720 != (undefined1  [8])local_1710) {
      operator_delete((void *)local_1720,(ulong)(local_1710[0]._M_allocated_capacity + 1));
    }
    if (local_17c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1720);
      if ((pointer)local_17c8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_17c8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_17a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_1720);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
      if (local_1720 != (undefined1  [8])0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1720 != (undefined1  [8])0x0)) {
          (**(code **)(*(size_type *)local_1720 + 8))();
        }
        local_1720 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_17c8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1720,&local_4b0);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_17c8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",(char *)local_1720,
               ((local_1778.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if (local_1720 != (undefined1  [8])local_1710) {
      operator_delete((void *)local_1720,(ulong)(local_1710[0]._M_allocated_capacity + 1));
    }
    if (local_17c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1720);
      if ((pointer)local_17c8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_17c8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_17a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_1720);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
      if (local_1720 != (undefined1  [8])0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1720 != (undefined1  [8])0x0)) {
          (**(code **)(*(size_type *)local_1720 + 8))();
        }
        local_1720 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_17c8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1720,&local_630);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_17c8,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",(char *)local_1720,
               local_1778.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if (local_1720 != (undefined1  [8])local_1710) {
      operator_delete((void *)local_1720,(ulong)(local_1710[0]._M_allocated_capacity + 1));
    }
    if (local_17c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1720);
      if ((pointer)local_17c8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_17c8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_17a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_17a0,(Message *)local_1720);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_17a0);
      if (local_1720 != (undefined1  [8])0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_1720 != (undefined1  [8])0x0)) {
          (**(code **)(*(size_type *)local_1720 + 8))();
        }
        local_1720 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_17c8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_17c8,&local_c80.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1720,(string *)local_17c8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17c8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_17c8 + 0x10)
     ) {
    operator_delete((void *)local_17c8._0_8_,local_17b8._M_allocated_capacity + 1);
  }
  local_1648.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1648,(value_type *)local_e48);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1648,(value_type *)local_c30);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1648,(value_type *)local_8c0);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1648,(value_type *)local_a78);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1720,&local_15e8);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1720,&local_1758);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)local_1720,&local_1648,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList
            ((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
              *)(local_1090 + 0x58),(ConfidentialTransaction *)local_1720);
  local_15d0 = local_1030;
  if (local_1090._88_8_ != local_1030) {
    lVar6 = local_1090._88_8_;
    do {
      cfd::core::Txid::Txid(&local_17a0,(Txid *)(lVar6 + 8));
      cfd::core::OutPoint::OutPoint((OutPoint *)local_17c8,&local_17a0,*(uint32_t *)(lVar6 + 0x28));
      local_1740._M_dataplus._M_p = (pointer)&local_1740.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1740,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey((Pubkey *)(local_1090 + 0x40),&local_1740);
      local_1628._M_dataplus._M_p = (pointer)&local_1628.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1628,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_ff8,&local_1628,kCustomChain,true);
      cfd::core::SigHashType::SigHashType(&local_c8c);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_1720,(OutPoint *)local_17c8,
                 (Pubkey *)(local_1090 + 0x40),&local_ff8,&local_c8c,true,(ByteData256 *)0x0,
                 (ByteData *)0x0);
      if (local_ff8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_ff8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_ff8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_ff8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1628._M_dataplus._M_p != &local_1628.field_2) {
        operator_delete(local_1628._M_dataplus._M_p,local_1628.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1090._64_8_ != (pointer)0x0) {
        operator_delete((void *)local_1090._64_8_,local_1090._80_8_ - local_1090._64_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1740._M_dataplus._M_p != &local_1740.field_2) {
        operator_delete(local_1740._M_dataplus._M_p,local_1740.field_2._M_allocated_capacity + 1);
      }
      local_17c8._0_8_ = &PTR__Txid_0087c9b8;
      if ((pointer)local_17c8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_17c8._8_8_,local_17b8._8_8_ - local_17c8._8_8_);
      }
      local_17a0._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_17a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_17a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_17a0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_17a0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar6 = lVar6 + 0x160;
    } while (lVar6 != local_15d0);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)(local_1090 + 0x58));
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1720);
  if (uVar4 != 0x1018) {
    uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1720);
    if (uVar4 != 0x1019) {
      uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1720);
      if (uVar4 != 0x101a) {
        local_17a0._vptr_Txid = (_func_int **)CONCAT44(local_17a0._vptr_Txid._4_4_,100);
        uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1720);
        local_1740._M_dataplus._M_p._0_4_ = uVar4;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)local_17c8,"100","context.GetVsize()",(int *)&local_17a0,
                   (uint *)&local_1740);
        if (local_17c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_17a0);
          if ((pointer)local_17c8._8_8_ == (pointer)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_17c8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1740,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x633,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1740,(Message *)&local_17a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1740);
          if (local_17a0._vptr_Txid != (_func_int **)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_17a0._vptr_Txid != (_func_int **)0x0)) {
              (**(code **)(*local_17a0._vptr_Txid + 8))();
            }
            local_17a0._vptr_Txid = (_func_int **)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_17c8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1648);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1720);
  local_c80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_0087c940;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_c80.transaction_);
  local_fa0 = &PTR__ConfidentialAssetId_0087ccc8;
  if (local_f98 != (pointer)0x0) {
    operator_delete(local_f98,(long)local_f88 - (long)local_f98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1778);
  cfd::core::Script::~Script((Script *)local_1090);
  cfd::UtxoData::~UtxoData((UtxoData *)local_15c0);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_1608);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_15e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((ElementsConfidentialAddress *)local_a78)->address_ + 0x10U)) {
    operator_delete(local_8e0._M_p,local_8d0._M_allocated_capacity + 1);
  }
  if (local_8f8 != (pointer)0x0) {
    operator_delete(local_8f8,(long)local_8e8 - (long)local_8f8);
  }
  cfd::core::Address::~Address((Address *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((ElementsConfidentialAddress *)local_8c0)->address_ + 0x10U)) {
    operator_delete(local_728._M_p,local_718._M_allocated_capacity + 1);
  }
  if (local_740 != (pointer)0x0) {
    operator_delete(local_740,(long)local_730 - (long)local_740);
  }
  cfd::core::Address::~Address((Address *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((ElementsConfidentialAddress *)local_c30)->address_ + 0x10U)) {
    operator_delete(local_a98._M_p,local_a88._M_allocated_capacity + 1);
  }
  if (local_ab0 != (pointer)0x0) {
    operator_delete(local_ab0,(long)local_aa0 - (long)local_ab0);
  }
  cfd::core::Address::~Address((Address *)local_c30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_p != &local_ca0) {
    operator_delete(local_cb0._M_p,local_ca0._M_allocated_capacity + 1);
  }
  if (local_cc8 != (pointer)0x0) {
    operator_delete(local_cc8,(long)local_cb8 - (long)local_cc8);
  }
  cfd::core::Address::~Address((Address *)local_e48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f08);
  cfd::core::Address::~Address(&local_630);
  cfd::core::Address::~Address(&local_4b0);
  cfd::core::Address::~Address(&local_330);
  cfd::core::Address::~Address(&local_1b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_f48);
  local_1020._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (local_1020.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1020.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1020.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1020.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_ed8.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ed8.super_Extkey.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ed8.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ed8.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_ed8.super_Extkey.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ed8.super_Extkey.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ed8.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ed8.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_ed8.super_Extkey.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ed8.super_Extkey.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ed8.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ed8.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_ed8.super_Extkey.chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ed8.super_Extkey.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ed8.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ed8.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_ed8.super_Extkey.fingerprint_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ed8.super_Extkey.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_ed8.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ed8.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1758);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_708);
  local_f70._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0087aa98;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_f70.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}